

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O2

void __thiscall slang::parsing::Preprocessor::Preprocessor(Preprocessor *this,Preprocessor *other)

{
  KeywordVersion local_41;
  LexerOptions *local_40;
  PreprocessorOptions *local_38;
  
  this->sourceManager = other->sourceManager;
  this->alloc = other->alloc;
  this->diagnostics = other->diagnostics;
  PreprocessorOptions::PreprocessorOptions(&this->options,&other->options);
  local_38 = &this->options;
  LexerOptions::LexerOptions(&this->lexerOptions,&other->lexerOptions);
  (this->lexerStack).
  super_SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
  .data_ = (pointer)(this->lexerStack).
                    super_SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
                    .firstElement;
  (this->lexerStack).
  super_SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
  .len = 0;
  (this->lexerStack).
  super_SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
  .cap = 2;
  (this->branchStack).super_SmallVectorBase<slang::parsing::Preprocessor::BranchEntry>.data_ =
       (pointer)(this->branchStack).super_SmallVectorBase<slang::parsing::Preprocessor::BranchEntry>
                .firstElement;
  (this->branchStack).super_SmallVectorBase<slang::parsing::Preprocessor::BranchEntry>.len = 0;
  (this->branchStack).super_SmallVectorBase<slang::parsing::Preprocessor::BranchEntry>.cap = 2;
  local_40 = &this->lexerOptions;
  boost::unordered::
  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>_>
  ::unordered_flat_map(&this->macros);
  (this->expandedTokens).super_SmallVectorBase<slang::parsing::Token>.data_ =
       (pointer)(this->expandedTokens).super_SmallVectorBase<slang::parsing::Token>.firstElement;
  (this->expandedTokens).super_SmallVectorBase<slang::parsing::Token>.len = 0;
  (this->expandedTokens).super_SmallVectorBase<slang::parsing::Token>.cap = 2;
  this->currentMacroToken = (Token *)0x0;
  Token::Token(&this->currentToken);
  Token::Token(&this->lastConsumed);
  this->inMacroBody = false;
  this->inIfDefCondition = false;
  (this->scratchTokenBuffer).super_SmallVectorBase<slang::parsing::Token>.data_ =
       (pointer)(this->scratchTokenBuffer).super_SmallVectorBase<slang::parsing::Token>.firstElement
  ;
  (this->scratchTokenBuffer).super_SmallVectorBase<slang::parsing::Token>.len = 0;
  (this->scratchTokenBuffer).super_SmallVectorBase<slang::parsing::Token>.cap = 2;
  boost::unordered::
  unordered_flat_set<const_char_*,_slang::hash<const_char_*,_void>,_std::equal_to<const_char_*>,_std::allocator<const_char_*>_>
  ::unordered_flat_set(&this->includeOnceHeaders);
  (this->keywordVersionStack).
  super__Vector_base<slang::parsing::KeywordVersion,_std::allocator<slang::parsing::KeywordVersion>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->keywordVersionStack).
  super__Vector_base<slang::parsing::KeywordVersion,_std::allocator<slang::parsing::KeywordVersion>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->keywordVersionStack).
  super__Vector_base<slang::parsing::KeywordVersion,_std::allocator<slang::parsing::KeywordVersion>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->activeTimeScale).super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
  super__Optional_payload_base<slang::TimeScale>._M_engaged = false;
  this->defaultNetType = WireKeyword;
  this->unconnectedDrive = Unknown;
  this->cellDefine = false;
  this->designElementDepth = 0;
  this->includeDepth = 0;
  this->protectEncryptDepth = 0;
  this->protectDecryptDepth = 0;
  this->protectLineLength = 0;
  this->protectBytes = 0;
  this->protectEncoding = Raw;
  NumberParser::NumberParser
            (&this->numberParser,this->diagnostics,this->alloc,(this->options).languageVersion);
  boost::unordered::
  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&),_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
  ::unordered_flat_map(&this->pragmaProtectHandlers);
  local_41 = LexerFacts::getDefaultKeywordVersion((this->options).languageVersion);
  std::vector<slang::parsing::KeywordVersion,_std::allocator<slang::parsing::KeywordVersion>_>::
  emplace_back<slang::parsing::KeywordVersion>(&this->keywordVersionStack,&local_41);
  return;
}

Assistant:

Preprocessor::Preprocessor(const Preprocessor& other) :
    sourceManager(other.sourceManager), alloc(other.alloc), diagnostics(other.diagnostics),
    options(other.options), lexerOptions(other.lexerOptions),
    numberParser(diagnostics, alloc, options.languageVersion) {

    keywordVersionStack.push_back(LF::getDefaultKeywordVersion(options.languageVersion));
}